

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicAtomicCase1::Run(BasicAtomicCase1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  void *pvVar2;
  bool *compile_error;
  ulong uVar3;
  int i;
  ulong uVar4;
  long lVar5;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "\nlayout(local_size_x = 8) in;\nlayout(std430, binding = 0) buffer Output {\n  uint g_add_output[8];\n  int g_sub_output[8];\n};\nshared uint g_add_value;\nshared int g_sub_value;\nvoid main() {\n  if (gl_LocalInvocationIndex == 0u) {\n    g_add_value = 0u;\n    g_sub_value = 7;\n  }\n  g_add_output[gl_LocalInvocationIndex] = 0u;\n  g_sub_output[gl_LocalInvocationIndex] = 0;\n  groupMemoryBarrier();\n  barrier();\n  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);\n  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_48);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar5 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar2 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>(pvVar2,(long)pvVar2 + 0x20,6)
    ;
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar2,(long)pvVar2 + 0x20);
    uVar4 = 0;
    lVar5 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + uVar4 * 4);
      if (uVar4 != uVar3) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",uVar4 & 0xffffffff,uVar3,
                   uVar4 & 0xffffffff);
        lVar5 = -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 8);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    pvVar2 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x20,0x20,1);
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>(pvVar2,(long)pvVar2 + 0x20,6)
    ;
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar2,(long)pvVar2 + 0x20);
    uVar4 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + uVar4 * 4);
      if (uVar4 != uVar3) {
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",uVar4 & 0xffffffff,uVar3,
                   uVar4 & 0xffffffff);
        lVar5 = -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 8);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 8) in;" NL "layout(std430, binding = 0) buffer Output {" NL
			   "  uint g_add_output[8];" NL "  int g_sub_output[8];" NL "};" NL "shared uint g_add_value;" NL
			   "shared int g_sub_value;" NL "void main() {" NL "  if (gl_LocalInvocationIndex == 0u) {" NL
			   "    g_add_value = 0u;" NL "    g_sub_value = 7;" NL "  }" NL
			   "  g_add_output[gl_LocalInvocationIndex] = 0u;" NL "  g_sub_output[gl_LocalInvocationIndex] = 0;" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);" NL
			   "  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		int* data;
		data = static_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		long error = NO_ERROR;
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		data = static_cast<int*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, sizeof(int) * 8, sizeof(int) * 8, GL_MAP_READ_BIT));
		std::sort(data, data + 8);
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				error = ERROR;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return error;
	}